

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant *
CreateConstantPointer
          (Allocator *allocator,SynBase *source,int offset,VariableData *container,
          TypeBase *structType,bool trackUsers)

{
  SynBase *allocator_00;
  bool bVar1;
  VmConstant *this;
  bool local_75;
  int local_74;
  VmType local_70;
  VmConstant *local_60;
  VmConstant *result;
  VmConstant *constant;
  VmConstant **local_48;
  VmConstant **cached;
  TypeBase *pTStack_38;
  bool trackUsers_local;
  TypeBase *structType_local;
  VariableData *container_local;
  SynBase *pSStack_20;
  int offset_local;
  SynBase *source_local;
  Allocator *allocator_local;
  
  cached._7_1_ = trackUsers;
  pTStack_38 = structType;
  structType_local = (TypeBase *)container;
  container_local._4_4_ = offset;
  pSStack_20 = source;
  source_local = (SynBase *)allocator;
  bVar1 = isType<TypeRef>(structType);
  local_75 = true;
  if (!bVar1) {
    local_75 = isType<TypeNullptr>(pTStack_38);
  }
  if (local_75 != false) {
    if (((cached._7_1_ & 1) != 0) && (structType_local != (TypeBase *)0x0)) {
      constant._4_4_ = container_local._4_4_ + 1;
      local_48 = SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::find
                           ((SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *)
                            &structType_local[1].refType,(int *)((long)&constant + 4));
      if (local_48 != (VmConstant **)0x0) {
        if (*local_48 != (VmConstant *)0x0) {
          return *local_48;
        }
        result = (VmConstant *)0x0;
      }
    }
    this = anon_unknown.dwarf_1aec77::get<VmConstant>((Allocator *)source_local);
    allocator_00 = source_local;
    local_70 = VmType::Pointer(pTStack_38);
    VmConstant::VmConstant(this,(Allocator *)allocator_00,local_70,pSStack_20);
    this->iValue = container_local._4_4_;
    this->container = (VariableData *)structType_local;
    local_60 = this;
    if (((cached._7_1_ & 1) != 0) && (structType_local != (TypeBase *)0x0)) {
      SmallArray<VmConstant_*,_8U>::push_back
                ((SmallArray<VmConstant_*,_8U> *)&structType_local->arrayTypes,&local_60);
      local_74 = container_local._4_4_ + 1;
      SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
                ((SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *)&structType_local[1].refType,
                 &local_74,&local_60);
    }
    return local_60;
  }
  __assert_fail("isType<TypeRef>(structType) || isType<TypeNullptr>(structType)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                ,0x61,
                "VmConstant *CreateConstantPointer(Allocator *, SynBase *, int, VariableData *, TypeBase *, bool)"
               );
}

Assistant:

VmConstant* CreateConstantPointer(Allocator *allocator, SynBase *source, int offset, VariableData *container, TypeBase *structType, bool trackUsers)
{
	assert(isType<TypeRef>(structType) || isType<TypeNullptr>(structType));

	if(trackUsers && container)
	{
		if(VmConstant **cached = container->offsetUsers.find(offset + 1))
		{
			if (VmConstant *constant = *cached)
				return constant;
		}
	}

	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Pointer(structType), source);

	result->iValue = offset;
	result->container = container;

	if(trackUsers && container)
	{
		container->users.push_back(result);
		container->offsetUsers.insert(offset + 1, result);
	}

	return result;
}